

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

opj_bool allocate_buffers(opj_t1_t *t1,int w,int h)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int flagssize;
  int datasize;
  
  iVar1 = in_ESI * in_EDX;
  if (*(int *)(in_RDI + 0x30) < iVar1) {
    free(*(void **)(in_RDI + 0x18));
    pvVar2 = malloc((long)iVar1 << 2);
    *(void **)(in_RDI + 0x18) = pvVar2;
    if (*(long *)(in_RDI + 0x18) == 0) {
      return 0;
    }
    *(int *)(in_RDI + 0x30) = iVar1;
  }
  memset(*(void **)(in_RDI + 0x18),0,(long)iVar1 << 2);
  *(int *)(in_RDI + 0x38) = in_ESI + 2;
  iVar1 = *(int *)(in_RDI + 0x38) * (in_EDX + 2);
  if (*(int *)(in_RDI + 0x34) < iVar1) {
    free(*(void **)(in_RDI + 0x20));
    pvVar2 = malloc((long)iVar1 << 1);
    *(void **)(in_RDI + 0x20) = pvVar2;
    if (*(long *)(in_RDI + 0x20) == 0) {
      return 0;
    }
    *(int *)(in_RDI + 0x34) = iVar1;
  }
  memset(*(void **)(in_RDI + 0x20),0,(long)iVar1 << 1);
  *(int *)(in_RDI + 0x28) = in_ESI;
  *(int *)(in_RDI + 0x2c) = in_EDX;
  return 1;
}

Assistant:

static opj_bool allocate_buffers(
		opj_t1_t *t1,
		int w,
		int h)
{
	int datasize=w * h;
	int flagssize;

	if(datasize > t1->datasize){
		opj_aligned_free(t1->data);
		t1->data = (int*) opj_aligned_malloc(datasize * sizeof(int));
		if(!t1->data){
			return OPJ_FALSE;
		}
		t1->datasize=datasize;
	}
	memset(t1->data,0,datasize * sizeof(int));

	t1->flags_stride=w+2;
	flagssize=t1->flags_stride * (h+2);

	if(flagssize > t1->flagssize){
		opj_aligned_free(t1->flags);
		t1->flags = (flag_t*) opj_aligned_malloc(flagssize * sizeof(flag_t));
		if(!t1->flags){
			return OPJ_FALSE;
		}
		t1->flagssize=flagssize;
	}
	memset(t1->flags,0,flagssize * sizeof(flag_t));

	t1->w=w;
	t1->h=h;

	return OPJ_TRUE;
}